

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs2.c
# Opt level: O3

int Wlc_NtkNodeDeref_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pNode,Vec_Bit_t *vUnmark)

{
  uint *puVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar5;
  
  iVar10 = 0;
  if ((undefined1  [24])((undefined1  [24])*pNode & (undefined1  [24])0x3d) != (undefined1  [24])0x1
     ) {
    lVar9 = ((long)pNode - (long)p->pObjs >> 3) * -0x5555555555555555;
    uVar7 = (uint)lVar9;
    if (((int)uVar7 < 0) || (vUnmark->nSize <= (int)uVar7)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                    ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
    }
    puVar1 = (uint *)((long)vUnmark->pArray + (ulong)(uVar7 >> 3 & 0xffffffc));
    *puVar1 = *puVar1 | 1 << ((byte)lVar9 & 0x1f);
    iVar10 = 1;
    uVar6 = (ulong)pNode->nFanins;
    if (0 < (int)pNode->nFanins) {
      lVar9 = 0;
      do {
        if ((2 < (uint)uVar6) || (paVar5 = &pNode->field_10, (*(uint *)pNode & 0x3f | 0x10) == 0x16)
           ) {
          paVar5 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pNode->field_10).pFanins[0];
        }
        iVar3 = paVar5->Fanins[lVar9];
        lVar4 = (long)iVar3;
        if ((lVar4 < 0) || ((p->vRefs).nSize <= iVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        piVar2 = (p->vRefs).pArray;
        iVar8 = piVar2[lVar4] + -1;
        piVar2[lVar4] = iVar8;
        if ((p->vRefs).nSize <= iVar3) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (iVar8 == 0) {
          if ((iVar3 == 0) || (p->nObjsAlloc <= iVar3)) {
            __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                          ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
          }
          iVar3 = Wlc_NtkNodeDeref_rec(p,p->pObjs + lVar4,vUnmark);
          iVar10 = iVar10 + iVar3;
        }
        lVar9 = lVar9 + 1;
        uVar6 = (ulong)(int)pNode->nFanins;
      } while (lVar9 < (long)uVar6);
    }
  }
  return iVar10;
}

Assistant:

static int Wlc_NtkNodeDeref_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pNode, Vec_Bit_t * vUnmark )
{
    int i, Fanin, Counter = 1;
    if ( Wlc_ObjIsCi(pNode) )
        return 0;
    Vec_BitWriteEntry( vUnmark, Wlc_ObjId(p, pNode), 1 );
    Wlc_ObjForEachFanin( pNode, Fanin, i )
    {
        Vec_IntAddToEntry( &p->vRefs, Fanin, -1 );
        if ( Vec_IntEntry(&p->vRefs, Fanin) == 0 )
            Counter += Wlc_NtkNodeDeref_rec( p, Wlc_NtkObj(p, Fanin), vUnmark );
    }
    return Counter;
}